

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O3

GCPtr<symbols::Object> __thiscall
evaluator::Evaluator::evalIntergerBinaryExpression
          (Evaluator *this,Token *op,GCPtr<symbols::Object> *leftExpr,
          GCPtr<symbols::Object> *rightExpr)

{
  TokenType TVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  Object *t;
  _Alloc_hider _Var5;
  int iVar6;
  int iVar7;
  bool value;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  lVar3 = __dynamic_cast(leftExpr->addr,&symbols::Object::typeinfo,&symbols::IntObject::typeinfo,0);
  lVar3 = *(long *)(lVar3 + 0x10);
  lVar4 = __dynamic_cast(rightExpr->addr,&symbols::Object::typeinfo,&symbols::IntObject::typeinfo,0)
  ;
  lVar4 = *(long *)(lVar4 + 0x10);
  TVar1 = op->Type;
  iVar6 = (int)lVar4;
  iVar7 = (int)lVar3;
  switch(TVar1) {
  case EQ:
    value = lVar3 == lVar4;
    break;
  case NOT_EQ:
    value = lVar3 != lVar4;
    break;
  case GT:
    value = lVar4 < lVar3;
    break;
  case LT:
    value = lVar3 < lVar4;
    break;
  case COMMA:
  case ASSIGN:
  case BANG:
    goto switchD_0010cb20_caseD_108;
  case PLUS:
    t = (Object *)operator_new(0x18);
    iVar7 = iVar6 + iVar7;
    t->_type = INTTYPE;
    t->_vptr_Object = (_func_int **)&PTR_type_00124b00;
    goto LAB_0010cc8b;
  case MINUS:
    t = (Object *)operator_new(0x18);
    iVar7 = iVar7 - iVar6;
    t->_type = INTTYPE;
    t->_vptr_Object = (_func_int **)&PTR_type_00124b00;
    goto LAB_0010cc8b;
  case ASTERISK:
    t = (Object *)operator_new(0x18);
    t->_type = INTTYPE;
    t->_vptr_Object = (_func_int **)&PTR_type_00124b00;
    iVar7 = iVar7 * iVar6;
LAB_0010cc8b:
    t[1]._vptr_Object = (_func_int **)(long)iVar7;
LAB_0010cc95:
    GCPtr<symbols::Object>::GCPtr((GCPtr<symbols::Object> *)this,t);
    return (GCPtr<symbols::Object>)(Object *)this;
  case DIV:
    if (lVar4 != 0) {
      t = (Object *)operator_new(0x18);
      t->_type = INTTYPE;
      t->_vptr_Object = (_func_int **)&PTR_type_00124b00;
      t[1]._vptr_Object = (_func_int **)(long)(int)(lVar3 / lVar4);
      goto LAB_0010cc95;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ZeroDivisionError: ","");
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"division by zero","");
    newError(this,&local_50,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    _Var5._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return (GCPtr<symbols::Object>)(Object *)this;
    }
    goto LAB_0010cd56;
  default:
    if (TVar1 == LT_EQ) {
      value = lVar3 <= lVar4;
      break;
    }
    if (TVar1 == GT_EQ) {
      value = lVar4 <= lVar3;
      break;
    }
    goto switchD_0010cb20_caseD_108;
  }
  nativeBooleanObject(this,value);
  return (GCPtr<symbols::Object>)(Object *)this;
switchD_0010cb20_caseD_108:
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Unknown Operator: ","");
  pcVar2 = (op->Literal)._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + (op->Literal)._M_string_length);
  newError(this,&local_70,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
  _Var5._M_p = local_70._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p == &local_70.field_2) {
    return (GCPtr<symbols::Object>)(Object *)this;
  }
LAB_0010cd56:
  operator_delete(_Var5._M_p,local_50.field_2._M_allocated_capacity + 1);
  return (GCPtr<symbols::Object>)(Object *)this;
}

Assistant:

GCPtr<Object> Evaluator::evalIntergerBinaryExpression(Token& op, GCPtr<Object>& leftExpr, GCPtr<Object>& rightExpr){
    auto leftValue = dynamic_cast<IntObject*>(leftExpr.raw())->value;
    auto rightValue = dynamic_cast<IntObject*>(rightExpr.raw())->value;
    switch (op.Type) {
     case TokenType::PLUS:
        return new IntObject(leftValue + rightValue);
     case TokenType::MINUS:
        return new IntObject(leftValue - rightValue);
     case TokenType::ASTERISK:
        return new IntObject(leftValue * rightValue);
     case TokenType::DIV:
        {
            if(rightValue == 0)
               return newError("ZeroDivisionError: ",  "division by zero");
            return new IntObject(leftValue / rightValue);
        }
     case TokenType::EQ:
        return nativeBooleanObject(leftValue == rightValue);
     case TokenType::NOT_EQ:
        return nativeBooleanObject(leftValue != rightValue);
     case TokenType::LT:
        return nativeBooleanObject(leftValue < rightValue);
     case TokenType::GT:
        return nativeBooleanObject(leftValue > rightValue);
     case TokenType::LT_EQ:
        return nativeBooleanObject(leftValue <= rightValue);
     case TokenType::GT_EQ:
        return nativeBooleanObject(leftValue >= rightValue);
     default:
        return newError("Unknown Operator: ", op.Literal);
    }
}